

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,1,0>::accumulateDerivativesDispatch2<true,false>
          (BeagleCPUImpl<float,_1,_0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  BeagleCPUImpl<float,1,0> *in_RDI;
  
  if (in_RCX == (double *)0x0) {
    accumulateDerivativesImpl<true,false,false>(in_RDI,in_RSI,in_RDX,(double *)0x0);
  }
  else {
    accumulateDerivativesImpl<true,false,true>(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesDispatch2(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    if (outSumSquaredDerivatives == NULL) {
        accumulateDerivativesImpl<DoDerivatives, DoSum, false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesImpl<DoDerivatives, DoSum, true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}